

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O2

int __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>::
getBoxType_Cpu(GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
               *this,Box *bx,Geometry *geom)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  int iVar9;
  int iVar10;
  Real RVar11;
  GpuArray<int,_3U> GVar12;
  RealArray local_48;
  
  GVar12 = Box::length3d(bx);
  iVar7 = 0;
  iVar9 = 0;
  iVar2 = GVar12.arr[0];
  if (GVar12.arr[0] < 1) {
    iVar2 = iVar9;
  }
  iVar5 = GVar12.arr[1];
  if (GVar12.arr[1] == 0 || GVar12.arr._0_8_ < 0) {
    iVar5 = iVar9;
  }
  iVar6 = GVar12.arr[2];
  if (GVar12.arr[2] < 1) {
    iVar6 = iVar9;
  }
  iVar9 = 0;
  iVar10 = 0;
  do {
    if (iVar10 == iVar6) {
      if (iVar7 == 0) {
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = (uint)(iVar9 == 0);
      }
      return uVar4;
    }
    for (iVar3 = 0; iVar3 != iVar5; iVar3 = iVar3 + 1) {
      iVar8 = 0;
      while (iVar2 != iVar8) {
        uVar1 = *(undefined8 *)(bx->smallend).vect;
        local_48._M_elems[0] =
             (double)(iVar8 + (int)uVar1) * (geom->super_CoordSys).dx[0] +
             (geom->prob_domain).xlo[0];
        local_48._M_elems[1] =
             (double)(iVar3 + (int)((ulong)uVar1 >> 0x20)) * (geom->super_CoordSys).dx[1] +
             (geom->prob_domain).xlo[1];
        local_48._M_elems[2] =
             (double)((bx->smallend).vect[2] + iVar10) * (geom->super_CoordSys).dx[2] +
             (geom->prob_domain).xlo[2];
        RVar11 = DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>::operator()
                           (&this->m_f,&local_48);
        if ((RVar11 != 0.0) || (NAN(RVar11))) {
          if (RVar11 <= 0.0) {
            iVar9 = iVar9 + 1;
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
        iVar8 = iVar8 + 1;
        if (0 < iVar9 && 0 < iVar7) {
          return 0;
        }
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int getBoxType_Cpu (const Box& bx, Geometry const& geom) const noexcept
    {
        const Real* problo = geom.ProbLo();
        const Real* dx = geom.CellSize();
        const auto& len3 = bx.length3d();
        const int* blo = bx.loVect();
        int nbody = 0, nzero = 0, nfluid = 0;
        for         (int k = 0; k < len3[2]; ++k) {
            for     (int j = 0; j < len3[1]; ++j) {
                for (int i = 0; i < len3[0]; ++i) {
                    RealArray xyz {AMREX_D_DECL(problo[0]+(i+blo[0])*dx[0],
                                                problo[1]+(j+blo[1])*dx[1],
                                                problo[2]+(k+blo[2])*dx[2])};
                    Real v = m_f(xyz);
                    if (v == 0.0_rt) {
                        ++nzero;
                    } else if (v > 0.0_rt) {
                        ++nbody;
                    } else {
                        ++nfluid;
                    }
                    if (nbody > 0 && nfluid > 0) return mixedcells;
                }
            }
        }

        if (nbody == 0) {
            return allregular;
        } else if (nfluid == 0) {
            return allcovered;
        } else {
            return mixedcells;
        }
    }